

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::
FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>::
add(FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
    *this,Block *node)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  
  piVar2 = (int *)(in_RSI + 0x530);
  LOCK();
  iVar1 = *piVar2;
  *piVar2 = *piVar2 + -0x80000000;
  UNLOCK();
  if (iVar1 == 0) {
    add_knowing_refcount_is_zero
              ((FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                *)0x8000000000000004,(Block *)0x8000000000000000);
  }
  return;
}

Assistant:

inline void add(N* node)
        {
#if MCDBGQ_NOLOCKFREE_FREELIST
            debug::DebugLock lock(mutex);
#endif      
            // We know that the should-be-on-freelist bit is 0 at this point, so it's safe to
            // set it using a fetch_add
            if (node->freeListRefs.fetch_add(SHOULD_BE_ON_FREELIST, std::memory_order_acq_rel) == 0) {
                // Oh look! We were the last ones referencing this node, and we know
                // we want to add it to the free list, so let's do it!
                add_knowing_refcount_is_zero(node);
            }
        }